

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

int __thiscall luna::Lexer::LexXEqual(Lexer *this,TokenDetail *detail,int equal_token)

{
  String *pSVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = this->current_;
  iVar2 = Next(this);
  if (iVar2 == 0x3d) {
    iVar2 = Next(this);
    iVar3 = equal_token;
  }
  pSVar1 = this->module_;
  this->current_ = iVar2;
  detail->token_ = iVar3;
  iVar2 = this->column_;
  detail->line_ = this->line_;
  detail->column_ = iVar2;
  detail->module_ = pSVar1;
  return iVar3;
}

Assistant:

int Lexer::LexXEqual(TokenDetail *detail, int equal_token)
    {
        int token = current_;

        int next = Next();
        if (next == '=')
        {
            current_ = Next();
            RETURN_NORMAL_TOKEN_DETAIL(detail, equal_token);
        }
        else
        {
            current_ = next;
            RETURN_NORMAL_TOKEN_DETAIL(detail, token);
        }
    }